

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

short __thiscall
mp::internal::TextReader<fmt::Locale>::ReadInt<short>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  short value;
  short local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  local_2a = 0;
  bVar1 = DoReadOptionalInt<short>(this,&local_2a);
  if (!bVar1) {
    local_18.field_1.values_ = (Value *)&local_28;
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x176218,&local_18);
  }
  return local_2a;
}

Assistant:

Int ReadInt() {
    Int value = 0;
    if (!DoReadOptionalInt(value))
      ReportError("expected integer");
    return value;
  }